

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2contains_point_query.h
# Opt level: O0

bool __thiscall
S2ContainsPointQuery<S2ShapeIndex>::ShapeContains
          (S2ContainsPointQuery<S2ShapeIndex> *this,Iterator *it,S2ClippedShape *clipped,S2Point *p)

{
  S2ShapeIndex *pSVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  S2VertexModel SVar6;
  undefined4 extraout_var;
  S2Point *a;
  S2Point *b;
  uint local_184;
  undefined1 local_180 [4];
  int sign;
  Edge edge_1;
  undefined1 local_148 [4];
  int i_1;
  undefined1 local_130 [8];
  S2CopyingEdgeCrosser crosser;
  Edge edge;
  int i;
  S2Shape *shape;
  int num_edges;
  bool inside;
  S2Point *p_local;
  S2ClippedShape *clipped_local;
  Iterator *it_local;
  S2ContainsPointQuery<S2ShapeIndex> *this_local;
  long *plVar7;
  
  shape._7_1_ = S2ClippedShape::contains_center(clipped);
  iVar3 = S2ClippedShape::num_edges(clipped);
  if (0 < iVar3) {
    pSVar1 = this->index_;
    uVar4 = S2ClippedShape::shape_id(clipped);
    iVar5 = (*pSVar1->_vptr_S2ShapeIndex[3])(pSVar1,(ulong)uVar4);
    plVar7 = (long *)CONCAT44(extraout_var,iVar5);
    iVar5 = (**(code **)(*plVar7 + 0x20))();
    if (iVar5 < 2) {
      SVar6 = S2ContainsPointQueryOptions::vertex_model(&this->options_);
      if (SVar6 != CLOSED) {
        return false;
      }
      edge.v1.c_[2]._4_4_ = 0;
      while( true ) {
        if (iVar3 <= edge.v1.c_[2]._4_4_) {
          return false;
        }
        iVar5 = S2ClippedShape::edge(clipped,edge.v1.c_[2]._4_4_);
        (**(code **)(*plVar7 + 0x18))(&crosser.crosser_.acb_,plVar7,iVar5);
        bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                          ((BasicVector<Vector3,_double,_3UL> *)&crosser.crosser_.acb_,p);
        if ((bVar2) ||
           (bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                              ((BasicVector<Vector3,_double,_3UL> *)(edge.v0.c_ + 2),p), bVar2))
        break;
        edge.v1.c_[2]._4_4_ = edge.v1.c_[2]._4_4_ + 1;
      }
      return true;
    }
    S2ShapeIndex::Iterator::center((S2Point *)local_148,it);
    S2CopyingEdgeCrosser::S2CopyingEdgeCrosser
              ((S2CopyingEdgeCrosser *)local_130,(S2Point *)local_148,p);
    for (edge_1.v1.c_[2]._4_4_ = 0; edge_1.v1.c_[2]._4_4_ < iVar3;
        edge_1.v1.c_[2]._4_4_ = edge_1.v1.c_[2]._4_4_ + 1) {
      iVar5 = S2ClippedShape::edge(clipped,edge_1.v1.c_[2]._4_4_);
      (**(code **)(*plVar7 + 0x18))(local_180,plVar7,iVar5);
      local_184 = S2CopyingEdgeCrosser::CrossingSign
                            ((S2CopyingEdgeCrosser *)local_130,(S2Point *)local_180,
                             (S2Point *)(edge_1.v0.c_ + 2));
      if (-1 < (int)local_184) {
        if (local_184 == 0) {
          SVar6 = S2ContainsPointQueryOptions::vertex_model(&this->options_);
          if ((SVar6 != SEMI_OPEN) &&
             ((bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                                 ((BasicVector<Vector3,_double,_3UL> *)local_180,p), bVar2 ||
              (bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                                 ((BasicVector<Vector3,_double,_3UL> *)(edge_1.v0.c_ + 2),p), bVar2)
              ))) {
            SVar6 = S2ContainsPointQueryOptions::vertex_model(&this->options_);
            return SVar6 == CLOSED;
          }
          a = S2CopyingEdgeCrosser::a((S2CopyingEdgeCrosser *)local_130);
          b = S2CopyingEdgeCrosser::b((S2CopyingEdgeCrosser *)local_130);
          bVar2 = S2::VertexCrossing(a,b,(S2Point *)local_180,(S2Point *)(edge_1.v0.c_ + 2));
          local_184 = (uint)bVar2;
        }
        shape._7_1_ = shape._7_1_ != local_184;
      }
    }
  }
  return shape._7_1_;
}

Assistant:

bool S2ContainsPointQuery<IndexType>::ShapeContains(
    const Iterator& it, const S2ClippedShape& clipped, const S2Point& p) const {
  bool inside = clipped.contains_center();
  const int num_edges = clipped.num_edges();
  if (num_edges > 0) {
    const S2Shape& shape = *index_->shape(clipped.shape_id());
    if (shape.dimension() < 2) {
      // Points and polylines can be ignored unless the vertex model is CLOSED.
      if (options_.vertex_model() != S2VertexModel::CLOSED) return false;

      // Otherwise, the point is contained if and only if it matches a vertex.
      for (int i = 0; i < num_edges; ++i) {
        auto edge = shape.edge(clipped.edge(i));
        if (edge.v0 == p || edge.v1 == p) return true;
      }
      return false;
    }
    // Test containment by drawing a line segment from the cell center to the
    // given point and counting edge crossings.
    S2CopyingEdgeCrosser crosser(it.center(), p);
    for (int i = 0; i < num_edges; ++i) {
      auto edge = shape.edge(clipped.edge(i));
      int sign = crosser.CrossingSign(edge.v0, edge.v1);
      if (sign < 0) continue;
      if (sign == 0) {
        // For the OPEN and CLOSED models, check whether "p" is a vertex.
        if (options_.vertex_model() != S2VertexModel::SEMI_OPEN &&
            (edge.v0 == p || edge.v1 == p)) {
          return (options_.vertex_model() == S2VertexModel::CLOSED);
        }
        sign = S2::VertexCrossing(crosser.a(), crosser.b(), edge.v0, edge.v1);
      }
      inside ^= sign;
    }
  }
  return inside;
}